

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

void insert_heap(U32Pair *min_heap,u32 index,u32 value,u32 count)

{
  U32Pair UVar1;
  uint uVar2;
  
  min_heap[index].value = value;
  min_heap[index].count = count;
  while( true ) {
    if (index == 0) {
      return;
    }
    uVar2 = index - 1 >> 1;
    if (min_heap[uVar2].count <= min_heap[index].count) break;
    UVar1 = min_heap[uVar2];
    min_heap[uVar2] = min_heap[index];
    min_heap[index] = UVar1;
    index = uVar2;
  }
  return;
}

Assistant:

void insert_heap(U32Pair* min_heap, u32 index, u32 value, u32 count) {
  min_heap[index].value = value;
  min_heap[index].count = count;
  while (index > 0) {
    u32 parent = (index - 1) / 2;
    if (min_heap[parent].count <= min_heap[index].count) {
      break;
    }
    swap_pair(&min_heap[parent], &min_heap[index]);
    index = parent;
  }
}